

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * verifychain(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_00;
  string description_01;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  long *plVar6;
  undefined8 uVar7;
  RPCHelpMan *in_RDI;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  code *pcVar9;
  undefined8 in_stack_fffffffffffff920;
  pointer in_stack_fffffffffffff928;
  pointer pRVar10;
  pointer in_stack_fffffffffffff930;
  pointer pRVar11;
  pointer in_stack_fffffffffffff938;
  pointer pRVar12;
  undefined1 in_stack_fffffffffffff940 [16];
  _Vector_impl_data in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff968 [16];
  pointer in_stack_fffffffffffff978;
  _Alloc_hider in_stack_fffffffffffff980;
  _Alloc_hider _Var13;
  size_type in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  _Alloc_hider in_stack_fffffffffffff9a0;
  _Alloc_hider _Var14;
  size_type in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  _Alloc_hider in_stack_fffffffffffff9c0;
  size_type in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  string local_620;
  string local_600;
  string local_5e0;
  ulong *local_5c0;
  undefined8 local_5b8;
  ulong local_5b0;
  undefined8 uStack_5a8;
  ulong *local_5a0;
  size_type local_598;
  ulong local_590;
  undefined8 uStack_588;
  long *local_580 [2];
  long local_570 [2];
  long *local_560 [2];
  long local_550 [2];
  RPCResult local_540;
  undefined1 local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined1 local_490 [32];
  long *local_470 [2];
  long local_460 [2];
  string local_450;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_430;
  undefined1 local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  undefined1 local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  pointer pbStack_390;
  undefined1 local_388 [32];
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  string local_348;
  undefined1 local_328 [32];
  undefined1 local_308 [24];
  long alStack_2f0 [8];
  __index_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [16];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"verifychain","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nVerifies blockchain database.\n","");
  local_2a8._M_allocated_capacity = (size_type)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"checklevel","");
  tinyformat::format<int>((string *)local_328,"%d, range=0-4",&DEFAULT_CHECKLEVEL);
  local_308._0_8_ = local_308 + 0x10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10)) {
    alStack_2f0[0]._0_4_ = local_328._24_4_;
    alStack_2f0[0]._4_4_ = local_328._28_4_;
  }
  else {
    local_308._0_8_ = local_328._0_8_;
  }
  local_308._8_8_ = local_328._8_8_;
  local_328._8_8_ = 0;
  local_328._16_4_ = local_328._16_4_ & 0xffffff00;
  local_2b0 = '\x01';
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_;
  local_328._0_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[2],util::MakeUnorderedList(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_>
            (&local_368,(util *)&CHECKLEVEL_DOC_abi_cxx11_,"\n");
  tinyformat::format<std::__cxx11::string>
            (&local_348,(tinyformat *)"How thorough the block verification is:\n%s",
             (char *)&local_368,pbVar4);
  local_3a8 = &local_398;
  local_3b0 = 0;
  local_3a0 = 0;
  local_398 = 0;
  local_388._0_8_ = (pointer)0x0;
  local_388._8_2_ = 0;
  local_388._10_6_ = 0;
  local_388._16_2_ = 0;
  local_388._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff908;
  name.field_2._8_8_ = in_stack_fffffffffffff910;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff920;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff918;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff928;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff930;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff938;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff940;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff950._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff950._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff950._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff968;
  description_00._M_string_length = (size_type)in_stack_fffffffffffff980._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff978;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff988;
  description_00.field_2._8_8_ = in_stack_fffffffffffff990;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff9a0._M_p;
  opts._0_8_ = in_stack_fffffffffffff998;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff9a8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9b0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff9b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9c0._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9c8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff9d0;
  opts.hidden = (bool)(char)in_stack_fffffffffffff9d8;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff9d8 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff9d8 >> 0x10);
  RPCArg::RPCArg((RPCArg *)local_288,name,(Type)&local_2a8,fallback,description_00,opts);
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"nblocks","");
  tinyformat::format<int>(&local_450,"%d, 0=all",&DEFAULT_CHECKBLOCKS);
  local_430._0_8_ = (long)&local_430 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p == &local_450.field_2) {
    local_430._24_4_ = local_450.field_2._8_4_;
    local_430._28_4_ = local_450.field_2._12_4_;
  }
  else {
    local_430._0_8_ = local_450._M_dataplus._M_p;
  }
  local_430._8_8_ = local_450._M_string_length;
  local_450._M_string_length = 0;
  local_450.field_2._M_allocated_capacity._0_4_ =
       local_450.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_3d8 = 1;
  local_470[0] = local_460;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_470,"The number of blocks to check.","");
  local_4b0 = &local_4a0;
  local_4b8 = 0;
  local_4a8 = 0;
  local_4a0 = 0;
  local_490._0_8_ = (pointer)0x0;
  local_490._8_2_ = 0;
  local_490._10_6_ = 0;
  local_490._16_2_ = 0;
  local_490._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff908;
  name_00.field_2._8_8_ = in_stack_fffffffffffff910;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff920;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff918;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff928;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff930;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff938;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff940;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff950._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff950._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff950._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff968;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff980._M_p;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff978;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff988;
  description_01.field_2._8_8_ = in_stack_fffffffffffff990;
  opts_00.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff9a0._M_p;
  opts_00._0_8_ = in_stack_fffffffffffff998;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff9a8;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9b0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff9b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9c0._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9c8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff9d0;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff9d8;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff9d8 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff9d8 >> 0x10);
  RPCArg::RPCArg(&local_180,name_00,(Type)local_3d0,fallback_00,description_01,opts_00);
  __l._M_len = 2;
  __l._M_array = (iterator)local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff968,__l,
             (allocator_type *)&stack0xfffffffffffff967);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_580,
             "Verification finished successfully. If false, check debug.log for reason.","");
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff908;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff910;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffff940;
  RPCResult::RPCResult
            (&local_540,BOOL,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff920,in_stack_fffffffffffff918)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),SUB81(local_560,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff8f8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff908;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff918;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff920;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar10;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar11;
  result._64_8_ = pRVar12;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff940._8_8_;
  result._88_24_ = in_stack_fffffffffffff950;
  result.m_cond._8_16_ = in_stack_fffffffffffff968;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff978;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff948,result);
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"verifychain","");
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"");
  HelpExampleCli(&local_5e0,&local_600,&local_620);
  _Var14._M_p = &stack0xfffffffffffff9b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9a0,"verifychain","");
  _Var13._M_p = &stack0xfffffffffffff990;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff980,"");
  HelpExampleRpc((string *)&stack0xfffffffffffff9c0,(string *)&stack0xfffffffffffff9a0,
                 (string *)&stack0xfffffffffffff980);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    uVar7 = local_5e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < in_stack_fffffffffffff9c8 + local_5e0._M_string_length) {
    uVar7 = 0xf;
    if (in_stack_fffffffffffff9c0._M_p != &stack0xfffffffffffff9d0) {
      uVar7 = in_stack_fffffffffffff9d0;
    }
    if (in_stack_fffffffffffff9c8 + local_5e0._M_string_length <= (ulong)uVar7) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff9c0,0,0,local_5e0._M_dataplus._M_p,
                       local_5e0._M_string_length);
      goto LAB_009c46a2;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_5e0,in_stack_fffffffffffff9c0._M_p,in_stack_fffffffffffff9c8);
LAB_009c46a2:
  local_5c0 = &local_5b0;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_5b0 = paVar1->_M_allocated_capacity;
    uStack_5a8 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_5b0 = paVar1->_M_allocated_capacity;
    local_5c0 = puVar2;
  }
  local_598 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_5c0 == &local_5b0) {
    uStack_588 = uStack_5a8;
    local_5a0 = &local_590;
  }
  else {
    local_5a0 = local_5c0;
  }
  local_590 = local_5b0;
  local_5b8 = 0;
  local_5b0 = local_5b0 & 0xffffffffffffff00;
  pcVar9 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1193:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1193:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1193:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar10;
  description.field_2._8_8_ = pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff940._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff940._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff978;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff968._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff968._8_8_;
  examples.m_examples.field_2._8_8_ = _Var13._M_p;
  local_5c0 = &local_5b0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff908)),description,args,
             (RPCResults)in_stack_fffffffffffff950,examples,(RPCMethodImpl *)&local_58);
  if (pcVar9 != (code *)0x0) {
    (*pcVar9)(&stack0xfffffffffffff908,&stack0xfffffffffffff908,3);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,local_590 + 1);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0,local_5b0 + 1);
  }
  if (in_stack_fffffffffffff9c0._M_p != &stack0xfffffffffffff9d0) {
    operator_delete(in_stack_fffffffffffff9c0._M_p,in_stack_fffffffffffff9d0 + 1);
  }
  if (_Var13._M_p != &stack0xfffffffffffff990) {
    operator_delete(_Var13._M_p,in_stack_fffffffffffff990 + 1);
  }
  if (_Var14._M_p != &stack0xfffffffffffff9b0) {
    operator_delete(_Var14._M_p,in_stack_fffffffffffff9b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff948);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.m_cond._M_dataplus._M_p != &local_540.m_cond.field_2) {
    operator_delete(local_540.m_cond._M_dataplus._M_p,
                    local_540.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.m_description._M_dataplus._M_p != &local_540.m_description.field_2) {
    operator_delete(local_540.m_description._M_dataplus._M_p,
                    local_540.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_540.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.m_key_name._M_dataplus._M_p != &local_540.m_key_name.field_2) {
    operator_delete(local_540.m_key_name._M_dataplus._M_p,
                    local_540.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff928);
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff968);
  lVar8 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8 + lVar8));
    plVar6 = *(long **)((long)alStack_2f0 + lVar8 + 0x28);
    plVar5 = (long *)((long)alStack_2f0 + lVar8 + 0x38);
    if (plVar5 != plVar6) {
      operator_delete(plVar6,*plVar5 + 1);
    }
    plVar6 = (long *)((long)alStack_2f0 + lVar8 + 0x10);
    if (plVar6 != *(long **)((long)alStack_2f0 + lVar8)) {
      operator_delete(*(long **)((long)alStack_2f0 + lVar8),*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)(local_388 + lVar8 + 8) != *(long **)((long)&pbStack_390 + lVar8)) {
      operator_delete(*(long **)((long)&pbStack_390 + lVar8),*(long *)(local_388 + lVar8 + 8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_490);
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_430._M_first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                             local_450.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_388);
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage)->m_names).
                                   _M_dataplus + 1));
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_308);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,CONCAT44(local_328._20_4_,local_328._16_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_allocated_capacity != &local_298) {
    operator_delete((void *)local_2a8._M_allocated_capacity,local_298._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan verifychain()
{
    return RPCHelpMan{"verifychain",
                "\nVerifies blockchain database.\n",
                {
                    {"checklevel", RPCArg::Type::NUM, RPCArg::DefaultHint{strprintf("%d, range=0-4", DEFAULT_CHECKLEVEL)},
                        strprintf("How thorough the block verification is:\n%s", MakeUnorderedList(CHECKLEVEL_DOC))},
                    {"nblocks", RPCArg::Type::NUM, RPCArg::DefaultHint{strprintf("%d, 0=all", DEFAULT_CHECKBLOCKS)}, "The number of blocks to check."},
                },
                RPCResult{
                    RPCResult::Type::BOOL, "", "Verification finished successfully. If false, check debug.log for reason."},
                RPCExamples{
                    HelpExampleCli("verifychain", "")
            + HelpExampleRpc("verifychain", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const int check_level{request.params[0].isNull() ? DEFAULT_CHECKLEVEL : request.params[0].getInt<int>()};
    const int check_depth{request.params[1].isNull() ? DEFAULT_CHECKBLOCKS : request.params[1].getInt<int>()};

    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);

    Chainstate& active_chainstate = chainman.ActiveChainstate();
    return CVerifyDB(chainman.GetNotifications()).VerifyDB(
               active_chainstate, chainman.GetParams().GetConsensus(), active_chainstate.CoinsTip(), check_level, check_depth) == VerifyDBResult::SUCCESS;
},
    };
}